

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFunctionBlocker.cxx
# Opt level: O0

bool __thiscall
cmFunctionBlocker::IsFunctionBlocked
          (cmFunctionBlocker *this,cmListFileFunction *lff,cmExecutionStatus *status)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> _Var1;
  unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  string *psVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer pcVar7;
  cmListFileContext *lfc_00;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *this_00;
  ostream *poVar8;
  char *extraout_RDX;
  char *extraout_RDX_00;
  vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> local_470;
  string local_458;
  undefined1 local_438 [8];
  ostringstream e_1;
  string local_2c0;
  undefined1 local_2a0 [8];
  ostringstream e;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_128;
  undefined1 local_100 [8];
  cmListFileContext closingContext;
  cmListFileContext *lfc;
  unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> self;
  cmMakefile *mf;
  cmExecutionStatus *status_local;
  cmListFileFunction *lff_local;
  cmFunctionBlocker *this_local;
  
  psVar6 = cmListFileFunction::LowerCaseName_abi_cxx11_(lff);
  _Var1 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
          std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
  iVar4 = (*this->_vptr_cmFunctionBlocker[2])();
  __y_00._M_len._4_4_ = extraout_var;
  __y_00._M_len._0_4_ = iVar4;
  __y_00._M_str = extraout_RDX;
  bVar3 = std::operator==(_Var1,__y_00);
  if (bVar3) {
    this->ScopeDepth = this->ScopeDepth + 1;
  }
  else {
    psVar6 = cmListFileFunction::LowerCaseName_abi_cxx11_(lff);
    _Var1 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
    iVar4 = (*this->_vptr_cmFunctionBlocker[3])();
    __y._M_len._4_4_ = extraout_var_00;
    __y._M_len._0_4_ = iVar4;
    __y._M_str = extraout_RDX_00;
    bVar3 = std::operator==(_Var1,__y);
    if ((bVar3) && (this->ScopeDepth = this->ScopeDepth - 1, this->ScopeDepth == 0)) {
      self._M_t.super___uniq_ptr_impl<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>.
      _M_t.super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
      super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl =
           (__uniq_ptr_data<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>,_true,_true>)
           cmExecutionStatus::GetMakefile(status);
      cmMakefile::RemoveFunctionBlocker((cmMakefile *)&lfc);
      pcVar7 = std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>::get
                         ((unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> *)
                          &lfc);
      if (pcVar7 == this) {
        lfc_00 = GetStartingContext(this);
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        optional(&local_128);
        cmListFileContext::FromListFileFunction
                  ((cmListFileContext *)local_100,lff,&lfc_00->FilePath,&local_128);
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        ~optional(&local_128);
        uVar5 = (*this->_vptr_cmFunctionBlocker[4])();
        if (((uVar5 & 1) == 0) ||
           (uVar5 = (*this->_vptr_cmFunctionBlocker[5])
                              (this,lff,self._M_t.
                                        super___uniq_ptr_impl<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                                        .super__Head_base<0UL,_cmFunctionBlocker_*,_false>.
                                        _M_head_impl), (uVar5 & 1) != 0)) {
          uVar5 = (*this->_vptr_cmFunctionBlocker[4])();
          if ((uVar5 & 1) == 0) {
            this_00 = cmListFileFunction::Arguments(lff);
            bVar3 = std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::empty
                              (this_00);
            if (!bVar3) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
              poVar8 = std::operator<<((ostream *)local_438,
                                       "A logical block closing on the line\n  ");
              poVar8 = ::operator<<(poVar8,(cmListFileContext *)local_100);
              std::operator<<(poVar8,"\nhas unexpected arguments.");
              uVar2 = self;
              std::__cxx11::ostringstream::str();
              cmMakefile::IssueMessage
                        ((cmMakefile *)
                         uVar2._M_t.
                         super___uniq_ptr_impl<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                         .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl,
                         AUTHOR_WARNING,&local_458);
              std::__cxx11::string::~string((string *)&local_458);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
            }
          }
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
          poVar8 = std::operator<<((ostream *)local_2a0,"A logical block opening on the line\n");
          poVar8 = std::operator<<(poVar8,"  ");
          poVar8 = ::operator<<(poVar8,lfc_00);
          poVar8 = std::operator<<(poVar8,"\n");
          poVar8 = std::operator<<(poVar8,"closes on the line\n");
          poVar8 = std::operator<<(poVar8,"  ");
          poVar8 = ::operator<<(poVar8,(cmListFileContext *)local_100);
          poVar8 = std::operator<<(poVar8,"\n");
          std::operator<<(poVar8,"with mis-matching arguments.");
          uVar2 = self;
          std::__cxx11::ostringstream::str();
          cmMakefile::IssueMessage
                    ((cmMakefile *)
                     uVar2._M_t.
                     super___uniq_ptr_impl<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                     .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl,AUTHOR_WARNING,
                     &local_2c0);
          std::__cxx11::string::~string((string *)&local_2c0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a0);
        }
        std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::vector
                  (&local_470,&this->Functions);
        iVar4 = (*this->_vptr_cmFunctionBlocker[6])(this,&local_470,status);
        std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::~vector(&local_470);
        cmListFileContext::~cmListFileContext((cmListFileContext *)local_100);
        std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>::~unique_ptr
                  ((unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> *)&lfc);
        return (bool)((byte)iVar4 & 1);
      }
      __assert_fail("self.get() == this",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmFunctionBlocker.cxx"
                    ,0x19,
                    "bool cmFunctionBlocker::IsFunctionBlocked(const cmListFileFunction &, cmExecutionStatus &)"
                   );
    }
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::push_back
            (&this->Functions,lff);
  return true;
}

Assistant:

bool cmFunctionBlocker::IsFunctionBlocked(const cmListFileFunction& lff,
                                          cmExecutionStatus& status)
{
  if (lff.LowerCaseName() == this->StartCommandName()) {
    this->ScopeDepth++;
  } else if (lff.LowerCaseName() == this->EndCommandName()) {
    this->ScopeDepth--;
    if (this->ScopeDepth == 0U) {
      cmMakefile& mf = status.GetMakefile();
      auto self = mf.RemoveFunctionBlocker();
      assert(self.get() == this);

      cmListFileContext const& lfc = this->GetStartingContext();
      cmListFileContext closingContext =
        cmListFileContext::FromListFileFunction(lff, lfc.FilePath);
      if (this->EndCommandSupportsArguments() &&
          !this->ArgumentsMatch(lff, mf)) {
        std::ostringstream e;
        /* clang-format off */
        e << "A logical block opening on the line\n"
          << "  " << lfc << "\n"
          << "closes on the line\n"
          << "  " << closingContext << "\n"
          << "with mis-matching arguments.";
        /* clang-format on */
        mf.IssueMessage(MessageType::AUTHOR_WARNING, e.str());
      } else if (!this->EndCommandSupportsArguments() &&
                 !lff.Arguments().empty()) {
        std::ostringstream e;
        /* clang-format off */
        e << "A logical block closing on the line\n"
          "  " << closingContext << "\n"
          "has unexpected arguments.";
        /* clang-format on */
        mf.IssueMessage(MessageType::AUTHOR_WARNING, e.str());
      }

      return this->Replay(std::move(this->Functions), status);
    }
  }

  this->Functions.push_back(lff);
  return true;
}